

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> * __thiscall
anurbs::NurbsCurveGeometry<3L>::weights
          (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
           *__return_storage_ptr__,NurbsCurveGeometry<3L> *this)

{
  NurbsCurveGeometry<3L> *this_local;
  
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)
             __return_storage_ptr__,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_weights,(type *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Ref<const Eigen::VectorXd> weights() const
    {
        return m_weights;
    }